

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_token.c
# Opt level: O2

void simple_token_tree_describe(simple_token *t,char *string)

{
  fwrite("=====>\n",7,1,_stderr);
  for (; t != (simple_token *)0x0; t = t->next) {
    simple_print_token(t,0,string);
  }
  fwrite("<=====\n",7,1,_stderr);
  return;
}

Assistant:

void simple_token_tree_describe(simple_token * t, const char * string) {
	fprintf(stderr, "=====>\n");

	while (t != NULL) {
		simple_print_token(t, 0, string);

		t = t->next;
	}

	fprintf(stderr, "<=====\n");
}